

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cpp
# Opt level: O1

void duckdb::StringUtil::URLDecodeBuffer
               (char *input,idx_t input_size,char *output,bool plus_to_space)

{
  bool bVar1;
  unsigned_long len;
  InvalidInputException *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  char *local_38;
  
  local_38 = output;
  URLDecodeInternal<duckdb::URLEncodeWrite>(input,input_size,&local_38,plus_to_space);
  len = NumericCastImpl<unsigned_long,_long,_false>::Convert((long)local_38 - (long)output);
  bVar1 = Utf8Proc::IsValid(output,len);
  if (bVar1) {
    return;
  }
  this = (InvalidInputException *)__cxa_allocate_exception(0x10);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,
             "Failed to decode string \"%s\" using URL decoding - decoded value is invalid UTF8","")
  ;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,input,input + input_size);
  InvalidInputException::InvalidInputException<std::__cxx11::string>(this,&local_58,&local_78);
  __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void StringUtil::URLDecodeBuffer(const char *input, idx_t input_size, char *output, bool plus_to_space) {
	char *output_start = output;
	URLDecodeInternal<URLEncodeWrite>(input, input_size, output, plus_to_space);
	if (!Utf8Proc::IsValid(output_start, NumericCast<idx_t>(output - output_start))) {
		throw InvalidInputException("Failed to decode string \"%s\" using URL decoding - decoded value is invalid UTF8",
		                            string(input, input_size));
	}
}